

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

table * util::getTable(string *name,
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                      *table_list)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>
  tl;
  string tl_name;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  table *local_60;
  table *local_58;
  string local_50;
  
  p_Var2 = (table_list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(table_list->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,*(long *)(p_Var2 + 1),
                 (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
      local_60 = *(table **)(p_Var2 + 2);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_80,local_80 + local_78);
      bVar1 = compareString(name,&local_50);
      if (bVar1) {
        local_58 = local_60;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      if (bVar1) {
        return local_58;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return (table *)0x0;
}

Assistant:

table* util::getTable(const string &name, map<string, table*> table_list){
    for(auto tl : table_list){
        //cout << tl.first << endl;
        string tl_name = tl.first;
        if(compareString(name, tl_name))
            return tl.second;
    }
    return nullptr;
}